

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reactor.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ssize_t sVar4;
  exception *e;
  int res;
  char c;
  event evs [3];
  native_type b;
  native_type a;
  native_type fds [2];
  error_code e_1;
  reactor r;
  int type;
  error_code *in_stack_fffffffffffffc40;
  ostream *in_stack_fffffffffffffc50;
  ostream *in_stack_fffffffffffffc60;
  undefined1 local_79;
  uint local_78;
  int local_74;
  uint local_70;
  int local_6c;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  error_code local_50;
  string local_40 [48];
  event local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 6; local_8 = local_8 + 1) {
    booster::aio::reactor::reactor((reactor *)&local_10,local_8);
    poVar3 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8);
    poVar3 = std::operator<<(poVar3,": ");
    booster::aio::reactor::name_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_40);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_40);
    std::error_code::error_code(in_stack_fffffffffffffc40);
    booster::aio::reactor::select((int)&local_10,-1,(error_code *)0x1);
    bVar1 = std::error_code::operator_cast_to_bool(&local_50);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"e");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x19);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    pair((native_type *)in_stack_fffffffffffffc60);
    local_5c = local_58;
    local_60 = local_54;
    booster::aio::reactor::select((int)&local_10,local_58);
    booster::aio::reactor::select((int)&local_10,local_60);
    iVar2 = booster::aio::reactor::poll(&local_10,(int)&local_78,3);
    if (iVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"r.poll(evs,3,0)==0");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x22);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    booster::aio::reactor::select((int)&local_10,local_5c);
    booster::aio::reactor::select((int)&local_10,local_60);
    iVar2 = booster::aio::reactor::poll(&local_10,(int)&local_78,3);
    if (iVar2 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"r.poll(evs,3,0)==2");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (((local_78 != local_5c) || (local_70 != local_60)) &&
       ((local_78 != local_60 || (local_70 != local_5c)))) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,
                               "(evs[0].fd==a && evs[1].fd==b) || (evs[0].fd==b && evs[1].fd==a)");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_74 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].events==reactor::out");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_6c != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[1].events==reactor::out");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    booster::aio::reactor::remove((reactor *)&local_10,(char *)(ulong)local_5c);
    iVar2 = booster::aio::reactor::poll(&local_10,(int)&local_78,3);
    if (iVar2 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"r.poll(evs,3,0)==1");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2b);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_78 != local_60) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].fd==b");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2c);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_74 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].events==reactor::out");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2d);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    local_79 = 0x78;
    send(local_5c,&local_79,1,0);
    booster::aio::reactor::select((int)&local_10,local_60);
    iVar2 = booster::aio::reactor::poll(&local_10,(int)&local_78,3);
    if (iVar2 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"r.poll(evs,3,1000)==1");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x32);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_78 != local_60) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].fd==b");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x33);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_74 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].events==reactor::in");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x34);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    booster::aio::reactor::select((int)&local_10,local_60);
    iVar2 = booster::aio::reactor::poll(&local_10,(int)&local_78,3);
    if (iVar2 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"r.poll(evs,3,0)==1");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x36);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_78 != local_60) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].fd==b");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x37);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_74 != 3) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].events==(reactor::out | reactor::in)");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x38);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    recv(local_60,&local_79,1,0);
    iVar2 = booster::aio::reactor::poll(&local_10,(int)&local_78,3);
    if (iVar2 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"r.poll(evs,3,0)==1");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3a);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_78 != local_60) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].fd==b");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3b);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_74 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].events==reactor::out");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3c);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    shutdown(local_5c,2);
    close(local_5c);
    booster::ptime::millisleep((longlong)in_stack_fffffffffffffc50);
    iVar2 = booster::aio::reactor::poll(&local_10,(int)&local_78,3);
    if (iVar2 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"r.poll(evs,3,0)==1");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x44);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_78 != local_60) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].fd==b");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x45);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    if (local_74 != 3) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar3 = std::operator<<(poVar3,"evs[0].events==(reactor::out | reactor::in)");
      poVar3 = std::operator<<(poVar3," at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x46);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    sVar4 = recv(local_60,&local_79,1,0);
    if ((int)sVar4 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      in_stack_fffffffffffffc60 = std::operator<<(poVar3,"(res=recv(b,&c,1,0))==0");
      poVar3 = std::operator<<(in_stack_fffffffffffffc60," at ");
      in_stack_fffffffffffffc50 = (ostream *)std::ostream::operator<<(poVar3,0x48);
      std::ostream::operator<<(in_stack_fffffffffffffc50,std::endl<char,std::char_traits<char>>);
      return_code = 1;
    }
    close(local_60);
    booster::aio::reactor::~reactor((reactor *)&local_10);
  }
  if (return_code == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return return_code;
}

Assistant:

int main()
{
	try {
		for(int type=reactor::use_default;type<=reactor::use_max;type++) {
			reactor r(type);

			std::cout << "Testing " << type << ": " << r.name() << std::endl;

			booster::system::error_code e;
			r.select(booster::aio::invalid_socket,booster::aio::reactor::in,e);
			TEST(e);

			native_type fds[2];
			pair(fds);
			native_type a=fds[0];
			native_type b=fds[1];
			r.select(a,reactor::in);
			r.select(b,reactor::in);
			reactor::event evs[3];
			TEST(r.poll(evs,3,0)==0);
			r.select(a,reactor::in | reactor::out);
			r.select(b,reactor::in | reactor::out);
			TEST(r.poll(evs,3,0)==2);

			TEST((evs[0].fd==a && evs[1].fd==b) || (evs[0].fd==b && evs[1].fd==a));
			TEST(evs[0].events==reactor::out);
			TEST(evs[1].events==reactor::out);
			r.remove(a);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::out);
			char c='x';
			send(a,&c,1,0);

			r.select(b,reactor::in);
			TEST(r.poll(evs,3,1000)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::in);
			r.select(b,reactor::in | reactor::out);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==(reactor::out | reactor::in));
			recv(b,&c,1,0);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::out);
			#ifdef SHUT_RDWR
			shutdown(a,SHUT_RDWR);
			#else
			shutdown(a,SD_BOTH);
			#endif
			closefd(a);
			booster::ptime::millisleep(100);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==(reactor::out | reactor::in));
			int res;
			TEST((res=recv(b,&c,1,0))==0);
			closefd(b);
		}
	}
	catch(std::exception const &e) {
		std::cerr << "Error: "<< e.what() << std::endl;
		return 1;
	}
	if(return_code == 0)
		std::cout << "Ok" <<std::endl;
	else
		std::cerr << "Fail " << std::endl;
	return return_code;
}